

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImPool<ImGuiTabBar>::Clear(ImPool<ImGuiTabBar> *this)

{
  ImGuiTabBar *pIVar1;
  char *ptr;
  ImGuiTabItem *ptr_00;
  ImGuiStoragePair *ptr_01;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (0 < (this->Map).Data.Size) {
    lVar3 = 8;
    lVar4 = 0;
    do {
      lVar2 = (long)*(int *)((long)&((this->Map).Data.Data)->key + lVar3);
      if (lVar2 != -1) {
        pIVar1 = (this->Buf).Data;
        ptr = pIVar1[lVar2].TabsNames.Buf.Data;
        if (ptr != (char *)0x0) {
          ImGui::MemFree(ptr);
        }
        ptr_00 = pIVar1[lVar2].Tabs.Data;
        if (ptr_00 != (ImGuiTabItem *)0x0) {
          ImGui::MemFree(ptr_00);
        }
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar4 < (this->Map).Data.Size);
  }
  ptr_01 = (this->Map).Data.Data;
  if (ptr_01 != (ImGuiStoragePair *)0x0) {
    (this->Map).Data.Size = 0;
    (this->Map).Data.Capacity = 0;
    ImGui::MemFree(ptr_01);
    (this->Map).Data.Data = (ImGuiStoragePair *)0x0;
  }
  pIVar1 = (this->Buf).Data;
  if (pIVar1 != (ImGuiTabBar *)0x0) {
    (this->Buf).Size = 0;
    (this->Buf).Capacity = 0;
    ImGui::MemFree(pIVar1);
    (this->Buf).Data = (ImGuiTabBar *)0x0;
  }
  this->FreeIdx = 0;
  this->AliveCount = 0;
  return;
}

Assistant:

void        Clear()                             { for (int n = 0; n < Map.Data.Size; n++) { int idx = Map.Data[n].val_i; if (idx != -1) Buf[idx].~T(); } Map.Clear(); Buf.clear(); FreeIdx = AliveCount = 0; }